

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newCol,bool scale)

{
  Item *pIVar1;
  uint *puVar2;
  int iVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  bool bVar6;
  byte bVar7;
  int *piVar8;
  undefined7 in_register_00000009;
  char *pcVar9;
  char *__filename;
  long lVar10;
  ulong uVar11;
  int idx;
  int local_134;
  undefined4 local_130;
  int local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  soplex local_d8 [8];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_80;
  
  local_130 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar1 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[(uint)n].idx;
    lVar10 = (long)(pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    local_134 = n;
    if (0 < lVar10) {
      do {
        pIVar4 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar3 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey
                [(pIVar1->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem[lVar10 + -1].idx].idx;
        pNVar5 = pIVar4[iVar3].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if (pNVar5 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          pIVar4 = pIVar4 + iVar3;
          pcVar9 = (char *)(long)(pIVar4->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .memused;
          if (0 < (long)pcVar9) {
            piVar8 = &pNVar5->idx;
            __filename = (char *)0x0;
            do {
              if (*piVar8 == n) {
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pIVar4,__filename);
                break;
              }
              __filename = __filename + 1;
              piVar8 = piVar8 + 0x15;
            } while (pcVar9 != __filename);
          }
        }
        bVar6 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar6);
    }
    (pIVar1->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newCol->up).m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newCol->up).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newCol->up).m_backend.exp;
    local_128.m_backend.neg = (newCol->up).m_backend.neg;
    local_128.m_backend.fpclass = (newCol->up).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newCol->up).m_backend.prec_elem;
    bVar7 = (byte)local_130;
    uVar11 = (ulong)(byte)local_130;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(this,(ulong)(uint)n,&local_128,uVar11);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newCol->low).m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newCol->low).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newCol->low).m_backend.exp;
    local_128.m_backend.neg = (newCol->low).m_backend.neg;
    local_128.m_backend.fpclass = (newCol->low).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newCol->low).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(this,(ulong)(uint)n,&local_128,(ulong)bVar7);
    local_128.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(newCol->object).m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newCol->object).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newCol->object).m_backend.exp;
    local_128.m_backend.neg = (newCol->object).m_backend.neg;
    local_128.m_backend.fpclass = (newCol->object).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newCol->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(this,(ulong)(uint)n,&local_128,uVar11);
    lVar10 = (long)(newCol->vec).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (0 < lVar10) {
      uVar11 = lVar10 + 1;
      lVar10 = lVar10 * 0x54 + -4;
      do {
        pNVar5 = (newCol->vec).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        local_12c = *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10);
        puVar2 = (uint *)((long)(&pNVar5->val + -1) + lVar10);
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(&(pNVar5->val).m_backend.data + -1) + lVar10);
        local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -0x30);
        local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -0x20);
        local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_128.m_backend.exp =
             *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -0x10);
        local_128.m_backend.neg =
             *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -0xc);
        local_128.m_backend.fpclass =
             *(fpclass_type *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -8);
        local_128.m_backend.prec_elem =
             *(int32_t *)((long)(pNVar5->val).m_backend.data._M_elems + lVar10 + -4);
        if ((byte)local_130 != '\0') {
          piVar8 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).scaleExp.data;
          local_d8 = (soplex  [8])local_128.m_backend.data._M_elems._0_8_;
          auStack_d0 = (uint  [2])local_128.m_backend.data._M_elems._8_8_;
          local_c8 = (uint  [2])local_128.m_backend.data._M_elems._16_8_;
          auStack_c0 = (uint  [2])local_128.m_backend.data._M_elems._24_8_;
          local_b8 = (uint  [2])local_128.m_backend.data._M_elems._32_8_;
          auStack_b0 = (uint  [2])local_128.m_backend.data._M_elems._40_8_;
          local_a8 = (uint  [2])local_128.m_backend.data._M_elems._48_8_;
          auStack_a0 = (uint  [2])local_128.m_backend.data._M_elems._56_8_;
          local_98 = local_128.m_backend.exp;
          local_94 = local_128.m_backend.neg;
          local_90 = local_128.m_backend.fpclass;
          local_8c = local_128.m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_80,local_d8,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)(piVar8[local_12c] +
                                     (this->
                                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).scaleExp.data[local_134]),(int)piVar8);
          local_128.m_backend.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
          local_128.m_backend.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
          local_128.m_backend.data._M_elems[0xe] = local_80.m_backend.data._M_elems[0xe];
          local_128.m_backend.data._M_elems[0xf] = local_80.m_backend.data._M_elems[0xf];
          local_128.m_backend.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
          local_128.m_backend.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
          local_128.m_backend.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
          local_128.m_backend.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
          local_128.m_backend.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
          local_128.m_backend.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
          local_128.m_backend.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
          local_128.m_backend.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
          local_128.m_backend.exp = local_80.m_backend.exp;
          local_128.m_backend.neg = local_80.m_backend.neg;
          local_128.m_backend.fpclass = local_80.m_backend.fpclass;
          local_128.m_backend.prec_elem = local_80.m_backend.prec_elem;
        }
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_134,1,&local_12c,&local_128);
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_12c,1,&local_134,&local_128);
        uVar11 = uVar11 - 1;
        lVar10 = lVar10 + -0x54;
      } while (1 < uVar11);
    }
  }
  return;
}

Assistant:

virtual void changeCol(int n, const LPColBase<R>& newCol, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& col = colVector_w(n);

      for(j = col.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& row = rowVector_w(col.index(j));
         int position = row.pos(n);

         assert(position != -1);

         if(position >= 0)
            row.remove(position);
      }

      col.clear();

      changeUpper(n, newCol.upper(), scale);
      changeLower(n, newCol.lower(), scale);
      changeObj(n, newCol.obj(), scale);

      const SVectorBase<R>& newcol = newCol.colVector();

      for(j = newcol.size() - 1; j >= 0; --j)
      {
         int idx = newcol.index(j);
         R val = newcol.value(j);

         if(scale)
            val = spxLdexp(val, LPColSetBase<R>::scaleExp[n] + LPRowSetBase<R>::scaleExp[idx]);

         LPColSetBase<R>::add2(n, 1, &idx, &val);
         LPRowSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }